

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O0

void __thiscall EventLoop::removeFromPoller(EventLoop *this,shared_ptr<Channel> *channel)

{
  element_type *this_00;
  shared_ptr<Channel> local_28;
  shared_ptr<Channel> *local_18;
  shared_ptr<Channel> *channel_local;
  EventLoop *this_local;
  
  local_18 = channel;
  channel_local = (shared_ptr<Channel> *)this;
  this_00 = std::__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->poller_);
  std::shared_ptr<Channel>::shared_ptr(&local_28,channel);
  Epoll::epoll_del(this_00,&local_28);
  std::shared_ptr<Channel>::~shared_ptr(&local_28);
  return;
}

Assistant:

void removeFromPoller(shared_ptr<Channel> channel) {
    // shutDownWR(channel->getFd());
    poller_->epoll_del(channel);
  }